

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiImageClearingTests.cpp
# Opt level: O2

void __thiscall
vkt::api::anon_unknown_0::ImageClearingTestInstance::pipelineImageBarrier
          (ImageClearingTestInstance *this,VkPipelineStageFlags srcStageMask,
          VkPipelineStageFlags dstStageMask,VkAccessFlags srcAccessMask,VkAccessFlags dstAccessMask,
          VkImageLayout oldLayout,VkImageLayout newLayout)

{
  undefined4 local_48 [2];
  undefined8 local_40;
  VkAccessFlags local_38;
  VkAccessFlags local_34;
  VkImageLayout local_30;
  VkImageLayout local_2c;
  undefined8 local_28;
  deUint64 local_20;
  VkImageAspectFlags local_18;
  undefined4 local_14;
  undefined4 uStack_10;
  undefined4 uStack_c;
  undefined4 uStack_8;
  
  local_48[0] = 0x2d;
  local_40 = 0;
  local_2c = newLayout;
  local_28 = 0xffffffffffffffff;
  local_20 = (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
  local_18 = this->m_imageAspectFlags;
  local_14 = 0;
  uStack_10 = 0xffffffff;
  uStack_c = 0;
  uStack_8 = 1;
  local_38 = srcAccessMask;
  local_34 = dstAccessMask;
  local_30 = oldLayout;
  (*this->m_vkd->_vptr_DeviceInterface[0x6d])
            (this->m_vkd,
             (this->m_commandBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
             srcStageMask,dstStageMask,0,0,0,0,0,1,local_48);
  return;
}

Assistant:

void ImageClearingTestInstance::pipelineImageBarrier(VkPipelineStageFlags srcStageMask, VkPipelineStageFlags dstStageMask, VkAccessFlags srcAccessMask, VkAccessFlags dstAccessMask, VkImageLayout oldLayout, VkImageLayout newLayout) const
{
	const VkImageMemoryBarrier		imageBarrier	=
	{
		VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,		// VkStructureType			sType;
		DE_NULL,									// const void*				pNext;
		srcAccessMask,								// VkAccessFlags			srcAccessMask;
		dstAccessMask,								// VkAccessFlags			dstAccessMask;
		oldLayout,									// VkImageLayout			oldLayout;
		newLayout,									// VkImageLayout			newLayout;
		VK_QUEUE_FAMILY_IGNORED,					// deUint32					srcQueueFamilyIndex;
		VK_QUEUE_FAMILY_IGNORED,					// deUint32					destQueueFamilyIndex;
		*m_image,									// VkImage					image;
		{
			m_imageAspectFlags,							// VkImageAspectFlags	aspectMask;
			0u,											// deUint32				baseMipLevel;
			VK_REMAINING_MIP_LEVELS,					// deUint32				levelCount;
			0u,											// deUint32				baseArrayLayer;
			1u,											// deUint32				layerCount;
		},											// VkImageSubresourceRange	subresourceRange;
	};

	m_vkd.cmdPipelineBarrier(*m_commandBuffer, srcStageMask, dstStageMask, 0, 0, DE_NULL, 0, DE_NULL, 1, &imageBarrier);
}